

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O3

ColoredAp * __thiscall
dg::DOD::createAp(ColoredAp *__return_storage_ptr__,DOD *this,SparseBitvector *nodes,CDGraph *graph,
                 CDNode *node)

{
  pointer puVar1;
  _Hash_node_base *p_Var2;
  CDNode *pCVar3;
  bool bVar4;
  CDNode *pCVar5;
  node_iterator __begin2;
  pointer puVar6;
  ContainedType *n;
  ColoredAp CAp;
  _Head_base<0UL,_dg::CDNode_*,_false> local_180;
  anon_class_16_2_de1edd05 local_178;
  ColoredAp local_168;
  
  ColoredAp::ColoredAp(&local_168);
  puVar6 = (graph->_nodes).
           super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (graph->_nodes).
           super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar6 != puVar1) {
    do {
      pCVar5 = (puVar6->_M_t).super___uniq_ptr_impl<dg::CDNode,_std::default_delete<dg::CDNode>_>.
               _M_t.super__Tuple_impl<0UL,_dg::CDNode_*,_std::default_delete<dg::CDNode>_>.
               super__Head_base<0UL,_dg::CDNode_*,_false>._M_head_impl;
      bVar4 = ADT::
              SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
              ::get(nodes,(ulong)pCVar5->_id);
      if (bVar4) {
        ColoredAp::createNode(&local_168,pCVar5);
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar1);
  }
  if (0x10 < (ulong)((long)local_168.Ap._nodes.
                           super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_168.Ap._nodes.
                          super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    if (local_168.Ap._nodes.
        super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_168.Ap._nodes.
        super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      puVar6 = local_168.Ap._nodes.
               super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_180._M_head_impl =
             (puVar6->_M_t).super___uniq_ptr_impl<dg::CDNode,_std::default_delete<dg::CDNode>_>._M_t
             .super__Tuple_impl<0UL,_dg::CDNode_*,_std::default_delete<dg::CDNode>_>.
             super__Head_base<0UL,_dg::CDNode_*,_false>._M_head_impl;
        pCVar5 = (CDNode *)0x0;
        if (local_168._rev_mapping._M_h._M_buckets
            [(ulong)local_180._M_head_impl % local_168._rev_mapping._M_h._M_bucket_count] !=
            (__node_base_ptr)0x0) {
          p_Var2 = local_168._rev_mapping._M_h._M_buckets
                   [(ulong)local_180._M_head_impl % local_168._rev_mapping._M_h._M_bucket_count]->
                   _M_nxt;
          pCVar3 = (CDNode *)p_Var2[1]._M_nxt;
          do {
            if (local_180._M_head_impl == pCVar3) {
              pCVar5 = (CDNode *)p_Var2[2]._M_nxt;
              break;
            }
            p_Var2 = p_Var2->_M_nxt;
            if (p_Var2 == (_Hash_node_base *)0x0) {
              pCVar5 = (CDNode *)0x0;
              break;
            }
            pCVar3 = (CDNode *)p_Var2[1]._M_nxt;
            pCVar5 = (CDNode *)0x0;
          } while ((ulong)pCVar3 % local_168._rev_mapping._M_h._M_bucket_count ==
                   (ulong)local_180._M_head_impl % local_168._rev_mapping._M_h._M_bucket_count);
        }
        local_178.CAp = &local_168;
        local_178.n = &local_180._M_head_impl;
        foreachFirstReachable<dg::ADT::SparseBitvectorImpl<unsigned_long,unsigned_long,unsigned_long,1ul,dg::MapImpl<unsigned_long,unsigned_long,std::map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>,dg::DOD::createAp(dg::ADT::SparseBitvectorImpl<unsigned_long,unsigned_long,unsigned_long,1ul,dg::MapImpl<unsigned_long,unsigned_long,std::map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>const&,dg::CDGraph&,dg::CDNode*)::_lambda(dg::CDNode*)_1_>
                  (this,nodes,pCVar5,&local_178);
        puVar6 = puVar6 + 1;
      } while (puVar6 != local_168.Ap._nodes.
                         super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    p_Var2 = local_168._mapping._M_h._M_buckets
             [(ulong)node % local_168._mapping._M_h._M_bucket_count]->_M_nxt;
    pCVar5 = (CDNode *)p_Var2[1]._M_nxt;
    while (pCVar5 != node) {
      p_Var2 = p_Var2->_M_nxt;
      pCVar5 = (CDNode *)p_Var2[1]._M_nxt;
    }
    if (8 < (ulong)((long)p_Var2[2]._M_nxt[1]._M_nxt - (long)(p_Var2[2]._M_nxt)->_M_nxt)) {
      ColoredAp::ColoredAp(__return_storage_ptr__,&local_168);
      goto LAB_001121eb;
    }
  }
  memset(__return_storage_ptr__,0,0x138);
  ColoredAp::ColoredAp(__return_storage_ptr__);
LAB_001121eb:
  std::
  _Hashtable<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::CDNode_*>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_168._rev_mapping._M_h);
  std::
  _Hashtable<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::CDNode_*>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_168._mapping._M_h);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::_M_erase((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              *)&local_168.reds,
             (_Link_type)
             local_168.reds._bits.
             super_map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::_M_erase((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              *)&local_168.blues,
             (_Link_type)
             local_168.blues._bits.
             super_map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<dg::CDNode_*,_dg::CDNode_*,_std::_Identity<dg::CDNode_*>,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>
  ::_M_erase(&local_168.Ap._predicates._M_t,
             (_Link_type)
             local_168.Ap._predicates._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
  ::~vector(&local_168.Ap._nodes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.Ap._name._M_dataplus._M_p != &local_168.Ap._name.field_2) {
    operator_delete(local_168.Ap._name._M_dataplus._M_p,
                    local_168.Ap._name.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

ColoredAp createAp(const ADT::SparseBitvector &nodes, CDGraph &graph,
                       CDNode *node) {
        ColoredAp CAp;
        CDGraph &Ap = CAp.Ap;

        // create nodes of graph
        for (auto *n : graph) {
            if (nodes.get(n->getID())) {
                CAp.createNode(n);
                // DBG(cda, "  - Ap has node " << n->getID() << " (which is " <<
                // nd->getID() << " in Ap)");
            }
        }

        assert(CAp.getNode(node) != nullptr);

        if (CAp.Ap.size() < 3) {
            return {}; // no DOD possible, bail out early
        }

        // Add edges. FIXME: we can use a better implementation
        for (auto *n : Ap) {
            auto *gn = CAp.getGNode(n);

            foreachFirstReachable(nodes, gn, [&](CDNode *cur) {
                auto *apn = CAp.getNode(cur);
                assert(apn);
                n->addSuccessor(apn);
                // DBG(cda, "  - Ap edge " << gn->getID() << " -> " <<
                // cur->getID());
            });
        }

        assert(CAp.getNode(node) && "node is not in Ap");
        if (CAp.getNode(node)->successors().size() < 2) {
            return {}; // no DOD possible, skip the rest of building colored Ap
        }

        return CAp;
    }